

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O0

void Undo_Redo_Selective(Am_Slot_Key allowed_slot,Am_Slot_Key method_slot,char *prompt_str)

{
  Am_Method_Wrapper *pAVar1;
  Am_Method_Wrapper *pAVar2;
  byte bVar3;
  Am_Value *pAVar4;
  Am_Value *pAVar5;
  ostream *poVar6;
  void *pvVar7;
  bool bVar8;
  Am_Object local_150;
  Am_Object local_148;
  Am_Object local_140;
  undefined1 local_138 [8];
  Am_Handler_Selective_Undo_Method method_1;
  Am_Value local_118;
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  undefined1 local_f0 [8];
  Am_Handler_Selective_Repeat_New_Method method;
  int which;
  Am_Value local_d0;
  Am_Value local_c0;
  Am_Object local_b0;
  int local_a8;
  byte local_a1;
  int cnt;
  bool allowed;
  Am_Value obj_modified;
  Am_Value current_selection;
  Am_Selective_New_Allowed_Method new_allowed_method;
  Am_Selective_Allowed_Method allowed_method;
  Am_Object new_cmd;
  Am_Object cmd;
  Am_String s;
  Am_Value_List local_38 [8];
  Am_Value_List l;
  bool use_new;
  Am_Object last_command;
  char *prompt_str_local;
  Am_Slot_Key method_slot_local;
  Am_Slot_Key allowed_slot_local;
  
  last_command.data = (Am_Object_Data *)prompt_str;
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffe0);
  bVar8 = method_slot != 0x14a;
  Am_Value_List::Am_Value_List(local_38);
  pAVar4 = (Am_Value *)Am_Object::Get(0xc670,0xc5);
  Am_Value_List::operator=(local_38,pAVar4);
  Am_String::Am_String((Am_String *)&cmd);
  Am_Object::Am_Object(&new_cmd);
  Am_Object::Am_Object((Am_Object *)&allowed_method.Call);
  Am_Selective_Allowed_Method::Am_Selective_Allowed_Method
            ((Am_Selective_Allowed_Method *)&new_allowed_method.Call);
  Am_Selective_New_Allowed_Method::Am_Selective_New_Allowed_Method
            ((Am_Selective_New_Allowed_Method *)&current_selection.value);
  Am_Value::Am_Value((Am_Value *)&obj_modified.value);
  Am_Value::Am_Value((Am_Value *)&cnt);
  if (bVar8) {
    pAVar5 = (Am_Value *)Am_Object::Get(0xc670,(ulong)allowed_slot);
    Am_Selective_Allowed_Method::operator=
              ((Am_Selective_Allowed_Method *)&new_allowed_method.Call,pAVar5);
  }
  else {
    pAVar5 = (Am_Value *)Am_Object::Get(0xc670,(ulong)allowed_slot);
    Am_Selective_New_Allowed_Method::operator=
              ((Am_Selective_New_Allowed_Method *)&current_selection.value,pAVar5);
    pAVar5 = Am_Object::Peek(&my_selection,0x169,0);
    Am_Value::operator=((Am_Value *)&obj_modified.value,(Am_Value *)pAVar5);
  }
  Am_Value_List::Start();
  local_a8 = 0;
  while( true ) {
    bVar3 = Am_Value_List::Last();
    if (((bVar3 ^ 0xff) & 1) == 0) break;
    pAVar4 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&new_cmd,pAVar4);
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)&new_cmd,0x150);
    Am_String::operator=((Am_String *)&cmd,pAVar4);
    pAVar5 = Am_Object::Peek(&new_cmd,0x16d,0);
    Am_Value::operator=((Am_Value *)&cnt,(Am_Value *)pAVar5);
    poVar6 = (ostream *)std::ostream::operator<<(&std::cout,local_a8);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = (ostream *)operator<<(poVar6,(Am_String *)&cmd);
    poVar6 = std::operator<<(poVar6," on ");
    poVar6 = (ostream *)operator<<(poVar6,(Am_Value *)&cnt);
    poVar6 = std::operator<<(poVar6," (cmd = ");
    poVar6 = (ostream *)operator<<(poVar6,(Am_Object *)&new_cmd);
    std::operator<<(poVar6,") ");
    pAVar2 = allowed_method.from_wrapper;
    pAVar1 = new_allowed_method.from_wrapper;
    if (bVar8) {
      Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffff28,(Am_Object *)&new_cmd);
      local_a1 = (*(code *)pAVar2)(&stack0xffffffffffffff28);
      local_a1 = local_a1 & 1;
      Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff28);
    }
    else {
      Am_Object::Am_Object(&local_b0,(Am_Object *)&new_cmd);
      Am_Value::Am_Value(&local_c0,(Am_Value *)&obj_modified.value.bool_value);
      Am_Value::Am_Value(&local_d0,(Am_Value *)&Am_No_Value);
      local_a1 = (*(code *)pAVar1)(&local_b0,&local_c0,&local_d0);
      local_a1 = local_a1 & 1;
      Am_Value::~Am_Value(&local_d0);
      Am_Value::~Am_Value(&local_c0);
      Am_Object::~Am_Object(&local_b0);
    }
    if ((local_a1 & 1) == 0) {
      std::operator<<((ostream *)&std::cout,"NOT OK\n");
    }
    else {
      std::operator<<((ostream *)&std::cout,"OK\n");
    }
    Am_Value_List::Next();
    local_a8 = local_a8 + 1;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"--Type index of command to ");
  poVar6 = std::operator<<(poVar6,(char *)last_command.data);
  poVar6 = std::operator<<(poVar6," (or -1 to exit): ");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&method.Call + 4));
  if (method.Call._4_4_ < 0) {
    method.Call._0_4_ = 1;
  }
  else {
    Am_Value_List::Start();
    for (local_a8 = 0; local_a8 < method.Call._4_4_; local_a8 = local_a8 + 1) {
      Am_Value_List::Next();
    }
    pAVar4 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&new_cmd,pAVar4);
    if (bVar8) {
      Am_Handler_Selective_Undo_Method::Am_Handler_Selective_Undo_Method
                ((Am_Handler_Selective_Undo_Method *)local_138);
      pAVar5 = (Am_Value *)Am_Object::Get(0xc670,(ulong)method_slot);
      Am_Handler_Selective_Undo_Method::operator=
                ((Am_Handler_Selective_Undo_Method *)local_138,pAVar5);
      poVar6 = std::operator<<((ostream *)&std::cout,(char *)last_command.data);
      poVar6 = std::operator<<(poVar6," on cmd ");
      poVar6 = (ostream *)operator<<(poVar6,(Am_Object *)&new_cmd);
      poVar6 = std::operator<<(poVar6," method = ");
      pvVar7 = (void *)operator<<(poVar6,(Am_Handler_Selective_Undo_Method *)local_138);
      pvVar7 = (void *)std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
      Am_Object::Am_Object(&local_148,(Am_Object *)&undo_handler);
      Am_Object::Am_Object(&local_150,(Am_Object *)&new_cmd);
      (*(code *)method_1.from_wrapper)(&local_140,&local_148,&local_150);
      Am_Object::operator=((Am_Object *)&allowed_method.Call,(Am_Object *)&local_140);
      Am_Object::~Am_Object(&local_140);
      Am_Object::~Am_Object(&local_150);
      Am_Object::~Am_Object(&local_148);
      poVar6 = std::operator<<((ostream *)&std::cout,"  new_cmd = ");
      pvVar7 = (void *)operator<<(poVar6,(Am_Object *)&allowed_method.Call);
      pvVar7 = (void *)std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
    }
    else {
      Am_Handler_Selective_Repeat_New_Method::Am_Handler_Selective_Repeat_New_Method
                ((Am_Handler_Selective_Repeat_New_Method *)local_f0);
      pAVar5 = (Am_Value *)Am_Object::Get(0xc670,0x14a);
      Am_Handler_Selective_Repeat_New_Method::operator=
                ((Am_Handler_Selective_Repeat_New_Method *)local_f0,pAVar5);
      poVar6 = std::operator<<((ostream *)&std::cout,(char *)last_command.data);
      poVar6 = std::operator<<(poVar6," on cmd ");
      poVar6 = (ostream *)operator<<(poVar6,(Am_Object *)&new_cmd);
      poVar6 = std::operator<<(poVar6," method = ");
      poVar6 = (ostream *)operator<<(poVar6,(Am_Handler_Selective_Repeat_New_Method *)local_f0);
      poVar6 = std::operator<<(poVar6," new obj = ");
      pvVar7 = (void *)operator<<(poVar6,(Am_Value *)&obj_modified.value.bool_value);
      pvVar7 = (void *)std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
      Am_Object::Am_Object(&local_100,(Am_Object *)&undo_handler);
      Am_Object::Am_Object(&local_108,(Am_Object *)&new_cmd);
      Am_Value::Am_Value(&local_118,(Am_Value *)&obj_modified.value.bool_value);
      Am_Value::Am_Value((Am_Value *)&method_1.Call,(Am_Value *)&Am_No_Value);
      (*(code *)method.from_wrapper)(&local_f8,&local_100,&local_108,&local_118,&method_1.Call);
      Am_Object::operator=((Am_Object *)&allowed_method.Call,(Am_Object *)&local_f8);
      Am_Object::~Am_Object(&local_f8);
      Am_Value::~Am_Value((Am_Value *)&method_1.Call);
      Am_Value::~Am_Value(&local_118);
      Am_Object::~Am_Object(&local_108);
      Am_Object::~Am_Object(&local_100);
      poVar6 = std::operator<<((ostream *)&std::cout,"  new_cmd = ");
      pvVar7 = (void *)operator<<(poVar6,(Am_Object *)&allowed_method.Call);
      pvVar7 = (void *)std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
    }
    method.Call._0_4_ = 0;
  }
  Am_Value::~Am_Value((Am_Value *)&cnt);
  Am_Value::~Am_Value((Am_Value *)&obj_modified.value);
  Am_Object::~Am_Object((Am_Object *)&allowed_method.Call);
  Am_Object::~Am_Object(&new_cmd);
  Am_String::~Am_String((Am_String *)&cmd);
  Am_Value_List::~Am_Value_List(local_38);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void
Undo_Redo_Selective(Am_Slot_Key allowed_slot, Am_Slot_Key method_slot,
                    const char *prompt_str)
{
  Am_Object last_command;
  bool use_new = (method_slot == Am_SELECTIVE_REPEAT_ON_NEW_METHOD);
  Am_Value_List l;
  l = undo_handler.Get(Am_COMMAND);
  Am_String s;
  Am_Object cmd, new_cmd;
  Am_Selective_Allowed_Method allowed_method;
  Am_Selective_New_Allowed_Method new_allowed_method;
  Am_Value current_selection, obj_modified;
  if (use_new) {
    new_allowed_method = undo_handler.Get(allowed_slot);
    //get the selection
    current_selection = my_selection.Peek(Am_VALUE);
  } else
    allowed_method = undo_handler.Get(allowed_slot);

  bool allowed;
  int cnt;
  for (l.Start(), cnt = 0; !l.Last(); l.Next(), cnt++) {
    cmd = l.Get();
    s = cmd.Get(Am_LABEL);
    obj_modified = cmd.Peek(Am_OBJECT_MODIFIED);
    std::cout << cnt << " " << s << " on " << obj_modified << " (cmd = " << cmd
              << ") ";
    if (use_new)
      allowed = new_allowed_method.Call(cmd, current_selection, Am_No_Value);
    else
      allowed = allowed_method.Call(cmd);
    if (allowed)
      std::cout << "OK\n";
    else
      std::cout << "NOT OK\n";
  }
  std::cout << "--Type index of command to " << prompt_str
            << " (or -1 to exit): " << std::flush;
  int which;
  std::cin >> which;
  if (which < 0)
    return;
  for (l.Start(), cnt = 0; cnt < which; l.Next(), cnt++)
    ;
  cmd = l.Get();
  if (use_new) {
    Am_Handler_Selective_Repeat_New_Method method;
    method = undo_handler.Get(method_slot);
    std::cout << prompt_str << " on cmd " << cmd << " method = " << method
              << " new obj = " << current_selection << std::endl
              << std::flush;
    new_cmd = method.Call(undo_handler, cmd, current_selection, Am_No_Value);
    std::cout << "  new_cmd = " << new_cmd << std::endl << std::flush;
  } else {
    Am_Handler_Selective_Undo_Method method;
    method = undo_handler.Get(method_slot);
    std::cout << prompt_str << " on cmd " << cmd << " method = " << method
              << std::endl
              << std::flush;
    new_cmd = method.Call(undo_handler, cmd);
    std::cout << "  new_cmd = " << new_cmd << std::endl << std::flush;
  }
}